

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall TasGrid::GridGlobal::loadGpuValues<float>(GridGlobal *this)

{
  double *cpu_data;
  CudaGlobalData<float> *in_RAX;
  pointer __p_00;
  CudaGlobalData<float> *this_00;
  pointer __p;
  _Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false> local_28;
  
  this_00 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl;
  local_28._M_head_impl = in_RAX;
  if (this_00 == (CudaGlobalData<float> *)0x0) {
    __p_00 = (pointer)operator_new(0xe8);
    memset(__p_00,0,0xe8);
    local_28._M_head_impl = (CudaGlobalData<float> *)0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
             *)&this->gpu_cachef,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
                   *)&local_28);
    this_00 = (this->gpu_cachef)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl;
  }
  if ((this_00->values).num_entries == 0) {
    cpu_data = (this->super_BaseCanonicalGrid).values.values.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    GpuVector<float>::load<double>
              (&this_00->values,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)cpu_data >> 3,cpu_data);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuValues() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (ccache->values.empty()) ccache->values.load(acceleration, values.begin(), values.end());
}